

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O3

void obx::internal::appendLastErrorText(obx_err err,string *outMessage)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  string __str;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar2 = obx_last_error_code();
  if (uVar2 == err) {
    if (err != 0) {
      obx_last_error_message();
      std::__cxx11::string::append((char *)outMessage);
      return;
    }
    __assert_fail("lastErr != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/objectbox[P]objectbox-ts-demo/build_O3/_deps/objectbox-download-src/include/objectbox.hpp"
                  ,199,"void obx::internal::appendLastErrorText(obx_err, std::string &)");
  }
  pcVar3 = (char *)std::__cxx11::string::append((char *)outMessage);
  uVar6 = -err;
  if (0 < err) {
    uVar6 = err;
  }
  uVar7 = 1;
  if (9 < uVar6) {
    uVar5 = (ulong)uVar6;
    uVar1 = 4;
    do {
      uVar7 = uVar1;
      uVar4 = (uint)uVar5;
      if (uVar4 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_00105dce;
      }
      if (uVar4 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_00105dce;
      }
      if (uVar4 < 10000) goto LAB_00105dce;
      uVar5 = uVar5 / 10000;
      uVar1 = uVar7 + 4;
    } while (99999 < uVar4);
    uVar7 = uVar7 + 1;
  }
LAB_00105dce:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar7 - (char)(err >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + ((uint)err >> 0x1f),uVar7,uVar6);
  std::__cxx11::string::_M_append(pcVar3,(ulong)local_50[0]);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (uVar2 != 0) {
    pcVar3 = (char *)std::__cxx11::string::append((char *)outMessage);
    uVar6 = -uVar2;
    if (0 < (int)uVar2) {
      uVar6 = uVar2;
    }
    uVar7 = 1;
    if (9 < uVar6) {
      uVar5 = (ulong)uVar6;
      uVar1 = 4;
      do {
        uVar7 = uVar1;
        uVar4 = (uint)uVar5;
        if (uVar4 < 100) {
          uVar7 = uVar7 - 2;
          goto LAB_00105ea3;
        }
        if (uVar4 < 1000) {
          uVar7 = uVar7 - 1;
          goto LAB_00105ea3;
        }
        if (uVar4 < 10000) goto LAB_00105ea3;
        uVar5 = uVar5 / 10000;
        uVar1 = uVar7 + 4;
      } while (99999 < uVar4);
      uVar7 = uVar7 + 1;
    }
LAB_00105ea3:
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar7 - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (uVar2 >> 0x1f),uVar7,uVar6);
    std::__cxx11::string::_M_append(pcVar3,(ulong)local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    pcVar3 = (char *)std::__cxx11::string::append((char *)outMessage);
    obx_last_error_message();
    pcVar3 = (char *)std::__cxx11::string::append(pcVar3);
    std::__cxx11::string::append(pcVar3);
  }
  return;
}

Assistant:

void appendLastErrorText(obx_err err, std::string& outMessage) {
    obx_err lastErr = obx_last_error_code();
    if (err == lastErr) {
        assert(lastErr != 0);  // checked indirectly against err before
        outMessage += obx_last_error_message();
    } else {  // Do not use obx_last_error_message() as primary msg because it originated from another code
        outMessage.append("Error code ").append(std::to_string(err));
        if (lastErr != 0) {
            outMessage.append(" (last: ").append(std::to_string(lastErr));
            outMessage.append(", last msg: ").append(obx_last_error_message()).append(")");
        }
    }
}